

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O3

Var Js::JavascriptNumber::EntryIsFinite(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  double value;
  int in_stack_00000010;
  undefined1 local_38 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x1da,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cd9f41;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_38 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_38,(CallInfo *)&args.super_Arguments.Values);
  if (((ulong)local_38 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x1db,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00cd9f41;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x1de,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00cd9f41;
    *puVar5 = 0;
  }
  if (((ulong)local_38 & 0xfffffe) == 0) {
LAB_00cd9ee2:
    return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           booleanFalse.ptr;
  }
  pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
  BVar4 = JavascriptOperators::IsAnyNumberValue(pvVar6);
  if (BVar4 == 0) goto LAB_00cd9ee2;
  pvVar6 = Arguments::operator[]((Arguments *)local_38,1);
  if (((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)pvVar6 >> 0x32 == 0) {
        value = JavascriptConversion::ToNumber_Full(pvVar6,pSVar1);
      }
      else {
        value = (double)((ulong)pvVar6 ^ 0xfffc000000000000);
      }
      goto LAB_00cd9efc;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) {
LAB_00cd9f41:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  value = (double)(int)pvVar6;
LAB_00cd9efc:
  bVar3 = NumberUtilities::IsFinite(value);
  pvVar6 = JavascriptBoolean::ToVar((uint)bVar3,pSVar1);
  return pvVar6;
}

Assistant:

Var JavascriptNumber::EntryIsFinite(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));
        CHAKRATEL_LANGSTATS_INC_BUILTINCOUNT(Number_Constructor_isFinite);

        if (args.Info.Count < 2 || !JavascriptOperators::IsAnyNumberValue(args[1]))
        {
            return scriptContext->GetLibrary()->GetFalse();
        }

        return JavascriptBoolean::ToVar(
            NumberUtilities::IsFinite(JavascriptConversion::ToNumber(args[1],scriptContext)),
            scriptContext);
    }